

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O0

DLword compute_hash(char *char_base,DLword offset,DLword length)

{
  ushort local_18;
  ushort local_16;
  DLword temp1;
  DLword number;
  DLword hash;
  DLword length_local;
  DLword offset_local;
  char *char_base_local;
  
  _number = char_base + (int)(uint)offset;
  local_16 = (short)*_number << 8;
  for (local_18 = 1; _number = _number + 1, (int)(uint)local_18 <= (int)(length - 1);
      local_18 = local_18 + 1) {
    local_16 = (local_16 + (local_16 & 0xfff) * 4) * 0x101 + (short)*_number;
  }
  return local_16;
}

Assistant:

DLword compute_hash(const char *char_base, DLword offset, DLword length) {
  DLword hash;
  DLword number;
  DLword temp1;

  char_base += offset;
  hash = (DLword)((*char_base) << 8); /* get first byte */
  char_base++;                     /* skip length area */

  for (number = 1; number <= length - 1; char_base++, number++) {
    hash = (hash + ((hash & 4095) << 2)) & 0x0ffff;
    temp1 = (hash + ((hash & 255) << 8)) & 0x0ffff;
    hash = (temp1 + (*char_base)) & 0x0ffff;
  }

  return (hash);

}